

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O1

int __thiscall
ncnn::GridSample::forward
          (GridSample *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer pMVar8;
  size_t sVar9;
  ulong uVar10;
  size_t sVar11;
  size_t sVar12;
  int *piVar13;
  int iVar14;
  int x;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  void *pvVar20;
  long lVar21;
  int iVar22;
  void *pvVar23;
  ulong uVar24;
  void *pvVar25;
  void *pvVar26;
  long lVar27;
  ulong uVar28;
  Mat *this_00;
  long lVar29;
  uint uVar30;
  int x_00;
  void *pvVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  int x_01;
  float *pfVar36;
  long lVar37;
  int y;
  bool bVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined4 uVar47;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  Mat m;
  long local_2b0;
  void *local_2a8;
  void *local_298;
  void *local_290;
  void *local_288;
  void *local_280;
  undefined8 local_238;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  int local_21c;
  ulong local_218;
  ulong local_1f8;
  void *local_1e8;
  void *local_1d8;
  Mat local_1c8;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  Mat *local_130;
  undefined8 local_128;
  Option *local_118;
  void *local_110;
  int local_108;
  uint local_104;
  int local_100;
  int local_fc;
  undefined1 local_f8 [16];
  ulong local_e8;
  size_t local_e0;
  Mat local_d8;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  void *local_48;
  void *local_40;
  void *local_38;
  
  pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar3 = pMVar8->w;
  iVar4 = pMVar8->h;
  iVar5 = pMVar8->d;
  uVar16 = pMVar8->c;
  uVar19 = (ulong)uVar16;
  iVar6 = pMVar8->dims;
  sVar9 = pMVar8->elemsize;
  local_130 = this_00;
  local_e0 = sVar9;
  if (iVar6 != 4) {
    if (iVar6 != 3) {
      return 0;
    }
    uVar28 = (ulong)(this->permute_fusion == 0);
    iVar7 = (&pMVar8[1].w)[uVar28];
    uVar15 = (&pMVar8[1].h)[uVar28 * 2];
    local_108 = iVar6;
    Mat::create(this_00,iVar7,uVar15,uVar16,sVar9,opt->blob_allocator);
    local_1c8.cstep = 0;
    local_1c8.data = (void *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.elemsize._0_4_ = 0;
    local_1c8.elemsize._4_4_ = 0;
    local_1c8.elempack = 0;
    local_1c8.allocator = (Allocator *)0x0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.d = 0;
    local_1c8.c = 0;
    local_118 = opt;
    Mat::create(&local_1c8,iVar7,uVar15,pMVar8[1].c,sVar9,opt->workspace_allocator);
    pvVar25 = local_1c8.data;
    if ((((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) ||
        (local_1c8.data == (void *)0x0)) || ((long)local_1c8.c * local_1c8.cstep == 0)) {
      piVar13 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) {
            if (local_1c8.data != (void *)0x0) {
              free(local_1c8.data);
            }
          }
          else {
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      return -100;
    }
    if (this->permute_fusion == 0) {
      if (0 < (int)uVar15) {
        pvVar20 = (void *)(CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) *
                           local_1c8.cstep + (long)local_1c8.data);
        pvVar26 = pMVar8[1].data;
        sVar9 = pMVar8[1].cstep;
        iVar6 = this->align_corner;
        sVar12 = pMVar8[1].elemsize;
        uVar28 = 0;
        pvVar23 = local_1c8.data;
        do {
          if (0 < iVar7) {
            lVar33 = 0;
            lVar34 = 0;
            do {
              fVar53 = *(float *)((long)pvVar26 + lVar34 * 8);
              if (iVar6 == 0) {
                fVar53 = (fVar53 + 1.0) * (float)iVar3 * 0.5 + -0.5;
              }
              else {
                fVar53 = (fVar53 * 0.5 + 0.5) * (float)(iVar3 + -1);
              }
              fVar54 = *(float *)((long)pvVar26 + lVar34 * 8 + 4);
              if (iVar6 == 0) {
                fVar54 = (fVar54 + 1.0) * (float)iVar4 * 0.5 + -0.5;
              }
              else {
                fVar54 = (fVar54 * 0.5 + 0.5) * (float)(iVar4 + -1);
              }
              *(float *)((long)pvVar23 + lVar34 * 4) = fVar53;
              *(float *)((long)pvVar20 + lVar34 * 4) = fVar54;
              lVar34 = lVar34 + 1;
              lVar33 = lVar33 + -4;
            } while (iVar7 != (int)lVar34);
            pvVar23 = (void *)((long)pvVar23 - lVar33);
            pvVar20 = (void *)((long)pvVar20 - lVar33);
          }
          uVar28 = uVar28 + 1;
          pvVar26 = (void *)((long)pvVar26 + sVar9 * sVar12);
        } while (uVar28 != uVar15);
      }
    }
    else if (0 < (int)uVar15) {
      pvVar20 = (void *)(CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) *
                         local_1c8.cstep + (long)local_1c8.data);
      pvVar26 = pMVar8[1].data;
      pvVar31 = (void *)(pMVar8[1].elemsize * pMVar8[1].cstep + (long)pvVar26);
      iVar6 = this->align_corner;
      uVar32 = 0;
      pvVar23 = local_1c8.data;
      do {
        if (0 < iVar7) {
          lVar33 = 0;
          lVar34 = 0;
          do {
            fVar53 = *(float *)((long)pvVar26 + lVar34 * 4);
            if (iVar6 == 0) {
              fVar53 = (fVar53 + 1.0) * (float)iVar3 * 0.5 + -0.5;
            }
            else {
              fVar53 = (fVar53 * 0.5 + 0.5) * (float)(iVar3 + -1);
            }
            fVar54 = *(float *)((long)pvVar31 + lVar34 * 4);
            if (iVar6 == 0) {
              fVar54 = (fVar54 + 1.0) * (float)iVar4 * 0.5 + -0.5;
            }
            else {
              fVar54 = (fVar54 * 0.5 + 0.5) * (float)(iVar4 + -1);
            }
            *(float *)((long)pvVar23 + lVar34 * 4) = fVar53;
            *(float *)((long)pvVar20 + lVar34 * 4) = fVar54;
            lVar34 = lVar34 + 1;
            lVar33 = lVar33 + -4;
          } while (iVar7 != (int)lVar34);
          pvVar26 = (void *)((long)pvVar26 - lVar33);
          pvVar31 = (void *)((long)pvVar31 - lVar33);
          pvVar23 = (void *)((long)pvVar23 - lVar33);
          pvVar20 = (void *)((long)pvVar20 - lVar33);
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 != uVar15);
    }
    iVar6 = this->sample_type;
    if (iVar6 == 1) {
      if (0 < (int)uVar16) {
        local_158 = (void *)(long)pMVar8->w;
        iVar6 = pMVar8->h;
        local_148 = pMVar8->data;
        local_168 = (void *)(pMVar8->cstep * pMVar8->elemsize);
        pvVar25 = local_130->data;
        sVar9 = local_130->cstep;
        sVar12 = local_130->elemsize;
        local_178 = local_1c8.data;
        local_128 = (void *)(CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) *
                             local_1c8.cstep + (long)local_1c8.data);
        lVar33 = pMVar8->elemsize * (long)local_158;
        local_1f8 = 0;
        do {
          pvVar26 = local_148;
          if (0 < (int)uVar15) {
            lVar34 = (long)local_168 * local_1f8;
            local_290 = (void *)(sVar9 * sVar12 * local_1f8 + (long)pvVar25);
            iVar18 = this->padding_mode;
            iVar17 = this->align_corner;
            uVar32 = 0;
            local_298 = local_178;
            local_238 = (long)local_128;
            do {
              if (0 < iVar7) {
                lVar21 = 0;
                lVar37 = 0;
                do {
                  fVar53 = *(float *)(local_238 + lVar37 * 4);
                  fVar39 = compute_coord(*(float *)((long)local_298 + lVar37 * 4),iVar3,iVar18,
                                         iVar17);
                  fVar40 = compute_coord(fVar53,iVar4,iVar18,iVar17);
                  fVar53 = floorf(fVar39);
                  uVar30 = (uint)fVar53;
                  fVar53 = floorf(fVar40);
                  uVar35 = (uint)fVar53;
                  iVar22 = (int)local_158;
                  fVar54 = 0.0;
                  fVar53 = 0.0;
                  if ((int)uVar35 < iVar6 && ((int)uVar30 < iVar22 && -1 < (int)(uVar35 | uVar30)))
                  {
                    fVar53 = *(float *)((long)pvVar26 +
                                       (long)(int)uVar30 * 4 + (int)uVar35 * lVar33 + lVar34);
                  }
                  uVar1 = uVar30 + 1;
                  if (((-1 < (int)(uVar1 | uVar35)) && ((int)uVar1 < iVar22)) &&
                     ((int)uVar35 < iVar6)) {
                    fVar54 = *(float *)((long)pvVar26 +
                                       (long)(int)uVar1 * 4 + (int)uVar35 * lVar33 + lVar34);
                  }
                  uVar2 = uVar35 + 1;
                  fVar42 = 0.0;
                  fVar41 = 0.0;
                  if ((int)uVar2 < iVar6 && (-1 < (int)(uVar2 | uVar30) && (int)uVar30 < iVar22)) {
                    fVar41 = *(float *)((long)pvVar26 +
                                       (long)(int)uVar30 * 4 + (int)uVar2 * lVar33 + lVar34);
                  }
                  if ((-1 < (int)(uVar2 | uVar1) && (int)uVar1 < iVar22) && (int)uVar2 < iVar6) {
                    fVar42 = *(float *)((long)pvVar26 +
                                       (long)(int)uVar1 * 4 + (int)uVar2 * lVar33 + lVar34);
                  }
                  fVar39 = fVar39 - (float)(int)uVar30;
                  fVar53 = fVar54 * fVar39 + fVar53 * (1.0 - fVar39);
                  *(float *)((long)local_290 + lVar37 * 4) =
                       ((fVar41 * (1.0 - fVar39) - fVar53) + fVar39 * fVar42) *
                       (fVar40 - (float)(int)uVar35) + fVar53;
                  lVar37 = lVar37 + 1;
                  lVar21 = lVar21 + -4;
                } while (iVar7 != (int)lVar37);
                local_290 = (void *)((long)local_290 - lVar21);
                local_298 = (void *)((long)local_298 - lVar21);
                local_238 = local_238 - lVar21;
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != uVar15);
          }
          local_1f8 = local_1f8 + 1;
        } while (local_1f8 != uVar19);
      }
    }
    else if (iVar6 == 2) {
      if (0 < (int)uVar16) {
        iVar6 = pMVar8->w;
        iVar18 = pMVar8->h;
        pvVar26 = pMVar8->data;
        sVar9 = pMVar8->elemsize;
        local_148 = (void *)(pMVar8->cstep * sVar9);
        local_168 = local_130->data;
        sVar12 = local_130->cstep;
        sVar11 = local_130->elemsize;
        local_178 = (void *)(CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) *
                             local_1c8.cstep + (long)local_1c8.data);
        local_1e8 = (void *)0x0;
        do {
          if (0 < (int)uVar15) {
            lVar33 = (long)local_148 * (long)local_1e8;
            local_290 = (void *)(sVar12 * sVar11 * (long)local_1e8 + (long)local_168);
            iVar17 = this->padding_mode;
            iVar22 = this->align_corner;
            uVar32 = 0;
            local_298 = pvVar25;
            pvVar23 = local_178;
            do {
              if (0 < iVar7) {
                local_158 = (void *)CONCAT44(local_158._4_4_,uVar32);
                lVar37 = 0;
                lVar34 = 0;
                do {
                  fVar53 = *(float *)((long)pvVar23 + lVar34 * 4);
                  fVar54 = compute_coord(*(float *)((long)local_298 + lVar34 * 4),iVar3,iVar17,
                                         iVar22);
                  fVar53 = compute_coord(fVar53,iVar4,iVar17,iVar22);
                  fVar54 = floorf(fVar54 + 0.5);
                  uVar35 = (uint)fVar54;
                  fVar53 = floorf(fVar53 + 0.5);
                  uVar32 = (uint)fVar53;
                  uVar47 = 0;
                  if (((-1 < (int)(uVar32 | uVar35)) && ((int)uVar35 < iVar6)) &&
                     ((int)uVar32 < iVar18)) {
                    uVar47 = *(undefined4 *)
                              ((long)pvVar26 +
                              (long)(int)uVar35 * 4 +
                              (long)(int)uVar32 * sVar9 * (long)iVar6 + lVar33);
                  }
                  *(undefined4 *)((long)local_290 + lVar34 * 4) = uVar47;
                  lVar34 = lVar34 + 1;
                  lVar37 = lVar37 + -4;
                } while (iVar7 != (int)lVar34);
                local_290 = (void *)((long)local_290 - lVar37);
                local_298 = (void *)((long)local_298 - lVar37);
                pvVar23 = (void *)((long)pvVar23 - lVar37);
                uVar32 = (uint)(float)local_158;
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != uVar15);
          }
          local_1e8 = (void *)((long)local_1e8 + 1);
        } while (local_1e8 != (void *)uVar19);
      }
    }
    else if ((iVar6 == 3) && (0 < (int)uVar16)) {
      uVar28 = 0;
      do {
        local_d8.c = pMVar8->d;
        uVar10 = pMVar8->elemsize;
        local_d8.data = (void *)(pMVar8->cstep * uVar28 * uVar10 + (long)pMVar8->data);
        local_d8.elempack = pMVar8->elempack;
        local_d8.allocator = pMVar8->allocator;
        local_d8.refcount._0_4_ = 0;
        local_d8.refcount._4_4_ = 0;
        local_d8.elemsize._0_4_ = (undefined4)uVar10;
        local_d8.elemsize._4_4_ = (undefined4)(uVar10 >> 0x20);
        local_d8.d = 1;
        local_d8.h = pMVar8->h;
        uVar24 = (long)pMVar8->h * (long)pMVar8->w;
        local_d8.w = pMVar8->w;
        local_d8.dims = pMVar8->dims + -1;
        local_d8.cstep = (uVar10 * uVar24 + 0xf & 0xfffffffffffffff0) / uVar10;
        if (pMVar8->dims == 4) {
          local_d8.cstep = uVar24;
        }
        local_e8 = uVar28;
        if (0 < (int)uVar15) {
          pvVar23 = (void *)(local_130->cstep * uVar28 * local_130->elemsize + (long)local_130->data
                            );
          pvVar26 = (void *)(CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) *
                             local_1c8.cstep + (long)local_1c8.data);
          local_100 = this->padding_mode;
          local_fc = this->align_corner;
          uVar32 = 0;
          pvVar25 = local_1c8.data;
          do {
            if (0 < iVar7) {
              lVar33 = 0;
              lVar34 = 0;
              local_104 = uVar32;
              local_48 = pvVar23;
              local_40 = pvVar26;
              local_38 = pvVar25;
              do {
                fVar53 = *(float *)((long)local_38 + lVar34 * 4);
                local_f8 = ZEXT416((uint)fVar53);
                fVar54 = *(float *)((long)local_40 + lVar34 * 4);
                fVar53 = floorf(fVar53);
                local_68 = (void *)CONCAT44(extraout_XMM0_Db,fVar53);
                x_01 = (int)fVar53;
                fVar53 = floorf(fVar54);
                iVar22 = local_fc;
                iVar17 = local_100;
                local_58 = CONCAT44(extraout_XMM0_Db_00,fVar53);
                y = (int)fVar53;
                x_00 = x_01 + -1;
                iVar6 = y + -1;
                iVar14 = x_01 + 1;
                iVar18 = y + 1;
                x = x_01 + 2;
                local_110 = (void *)CONCAT44(local_110._4_4_,y + 2);
                fVar53 = get_value_bounded(&local_d8,x_00,iVar6,local_100,local_fc);
                fVar39 = get_value_bounded(&local_d8,x_01,iVar6,iVar17,iVar22);
                local_158 = (void *)CONCAT44(extraout_XMM0_Db_01,fVar39);
                fVar39 = get_value_bounded(&local_d8,iVar14,iVar6,iVar17,iVar22);
                local_148 = (void *)CONCAT44(extraout_XMM0_Db_02,fVar39);
                fVar39 = get_value_bounded(&local_d8,x,iVar6,iVar17,iVar22);
                fVar40 = get_value_bounded(&local_d8,x_00,y,iVar17,iVar22);
                local_168 = (void *)CONCAT44(extraout_XMM0_Db_03,fVar40);
                fVar40 = get_value_bounded(&local_d8,x_01,y,iVar17,iVar22);
                fVar41 = get_value_bounded(&local_d8,iVar14,y,iVar17,iVar22);
                local_78 = (void *)CONCAT44(extraout_XMM0_Db_04,fVar41);
                fVar41 = get_value_bounded(&local_d8,x,y,iVar17,iVar22);
                fVar42 = get_value_bounded(&local_d8,x_00,iVar18,iVar17,iVar22);
                local_128 = (void *)CONCAT44(extraout_XMM0_Db_05,fVar42);
                fVar42 = get_value_bounded(&local_d8,x_01,iVar18,iVar17,iVar22);
                local_178 = (void *)CONCAT44(extraout_XMM0_Db_06,fVar42);
                fVar42 = get_value_bounded(&local_d8,iVar14,iVar18,iVar17,iVar22);
                local_88 = (void *)CONCAT44(extraout_XMM0_Db_07,fVar42);
                fVar42 = get_value_bounded(&local_d8,x,iVar18,iVar17,iVar22);
                iVar6 = (int)local_110;
                fVar43 = get_value_bounded(&local_d8,x_00,(int)local_110,iVar17,iVar22);
                fVar44 = get_value_bounded(&local_d8,x_01,iVar6,iVar17,iVar22);
                local_238._0_4_ = get_value_bounded(&local_d8,iVar14,iVar6,iVar17,iVar22);
                local_238._4_4_ = extraout_XMM0_Db_08;
                uStack_230 = extraout_XMM0_Dc;
                uStack_22c = extraout_XMM0_Dd;
                fVar45 = get_value_bounded(&local_d8,x,iVar6,iVar17,iVar22);
                fVar46 = (float)local_f8._0_4_ - (float)(int)(float)local_68;
                fVar54 = fVar54 - (float)(int)(float)local_58;
                fVar48 = fVar46 + 1.0;
                fVar52 = fVar54 + 1.0;
                fVar51 = 1.0 - fVar46;
                fVar49 = (3.0 - fVar48 * 6.0) + (3.75 - fVar48 * 0.75) * fVar48 * fVar48;
                fVar50 = (fVar46 * 1.25 + -2.25) * fVar46 * fVar46 + 1.0;
                fVar51 = (fVar51 * 1.25 + -2.25) * fVar51 * fVar51;
                fVar48 = 1.0 - fVar54;
                fVar46 = (3.0 - fVar52 * 6.0) + (3.75 - fVar52 * 0.75) * fVar52 * fVar52;
                fVar54 = (fVar54 * 1.25 + -2.25) * fVar54 * fVar54 + 1.0;
                fVar48 = (fVar48 * 1.25 + -2.25) * fVar48 * fVar48;
                fVar52 = fVar51 + 1.0;
                fVar51 = fVar49 + fVar51 + fVar50;
                *(float *)((long)local_48 + lVar34 * 4) =
                     (fVar46 + fVar54 + fVar48) *
                     (fVar45 * fVar51 -
                     ((float)local_238 * fVar52 + fVar50 * fVar44 + fVar49 * fVar43)) +
                     fVar54 * ((fVar52 * (float)local_78 +
                               (float)local_168 * fVar49 + fVar40 * fVar50) - fVar41 * fVar51) +
                     (fVar48 + 1.0) *
                     ((fVar52 * (float)local_88 +
                      (float)local_178 * fVar50 + SUB84(local_128,0) * fVar49) - fVar42 * fVar51) +
                     fVar46 * (((float)local_148 * fVar52 +
                               (float)local_158 * fVar50 + fVar53 * fVar49) - fVar39 * fVar51);
                lVar34 = lVar34 + 1;
                lVar33 = lVar33 + -4;
              } while (iVar7 != (int)lVar34);
              pvVar23 = (void *)((long)local_48 - lVar33);
              pvVar25 = (void *)((long)local_38 - lVar33);
              pvVar26 = (void *)((long)local_40 - lVar33);
              uVar32 = local_104;
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar15);
        }
        uVar28 = local_e8;
        piVar13 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              if (local_d8.data != (void *)0x0) {
                free(local_d8.data);
              }
            }
            else {
              (*(local_d8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_d8.cstep = 0;
        local_d8.data = (void *)0x0;
        local_d8.refcount._0_4_ = 0;
        local_d8.refcount._4_4_ = 0;
        local_d8.elemsize._0_4_ = 0;
        local_d8.elemsize._4_4_ = 0;
        local_d8.elempack = 0;
        local_d8.dims = 0;
        local_d8.w = 0;
        local_d8.h = 0;
        local_d8.d = 0;
        local_d8.c = 0;
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar19);
    }
    opt = local_118;
    this_00 = local_130;
    piVar13 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_1c8.allocator == (Allocator *)0x0) {
          if (local_1c8.data != (void *)0x0) {
            free(local_1c8.data);
          }
        }
        else {
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1c8.cstep = 0;
    local_1c8.data = (void *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.elemsize._0_4_ = 0;
    local_1c8.elemsize._4_4_ = 0;
    local_1c8.elempack = 0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.d = 0;
    local_1c8.c = 0;
    if (local_108 != 4) {
      return 0;
    }
  }
  sVar9 = local_e0;
  bVar38 = this->permute_fusion == 0;
  iVar6 = (&pMVar8[1].w)[bVar38];
  iVar7 = (&pMVar8[1].h)[bVar38];
  uVar15 = (&pMVar8[1].d)[bVar38];
  local_118 = opt;
  Mat::create(this_00,iVar6,iVar7,uVar15,uVar16,local_e0,opt->blob_allocator);
  local_1c8.cstep = 0;
  local_1c8.data = (void *)0x0;
  local_1c8.refcount._0_4_ = 0;
  local_1c8.refcount._4_4_ = 0;
  local_1c8.elemsize._0_4_ = 0;
  local_1c8.elemsize._4_4_ = 0;
  local_1c8.elempack = 0;
  local_1c8.allocator = (Allocator *)0x0;
  local_1c8.dims = 0;
  local_1c8.w = 0;
  local_1c8.h = 0;
  local_1c8.d = 0;
  local_1c8.c = 0;
  local_178 = (void *)(ulong)uVar15;
  Mat::create(&local_1c8,iVar6,iVar7,uVar15,pMVar8[1].c,sVar9,local_118->workspace_allocator);
  local_21c = -100;
  if ((((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) &&
      (local_298 = local_1c8.data, local_1c8.data != (void *)0x0)) &&
     ((long)local_1c8.c * local_1c8.cstep != 0)) {
    if (this->permute_fusion == 0) {
      if (0 < (int)(float)local_178) {
        lVar33 = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) * local_1c8.cstep
        ;
        local_238 = (long)((long)local_1c8.data + lVar33 * 2);
        pvVar26 = (void *)(lVar33 + (long)local_1c8.data);
        pvVar25 = pMVar8[1].data;
        local_128 = (void *)(pMVar8[1].cstep * pMVar8[1].elemsize);
        local_158 = (void *)CONCAT44(local_158._4_4_,(float)iVar3 * 0.5);
        local_148 = (void *)CONCAT44(local_148._4_4_,(float)iVar5 * 0.5);
        uVar28 = 0;
        do {
          if (0 < iVar7) {
            pfVar36 = (float *)((long)local_128 * uVar28 + (long)pvVar25);
            iVar18 = this->padding_mode;
            iVar17 = this->align_corner;
            iVar22 = 0;
            do {
              if (0 < iVar6) {
                local_168 = (void *)CONCAT44(local_168._4_4_,iVar22);
                lVar33 = 0;
                lVar34 = 0;
                do {
                  if (iVar17 == 0) {
                    fVar53 = (*pfVar36 + 1.0) * (float)local_158 + -0.5;
                  }
                  else {
                    fVar53 = (*pfVar36 * 0.5 + 0.5) * (float)(iVar3 + -1);
                  }
                  fVar54 = pfVar36[1];
                  fVar39 = pfVar36[2];
                  fVar53 = compute_coord(fVar53,iVar3,iVar18,iVar17);
                  if (iVar17 == 0) {
                    fVar54 = (fVar54 + 1.0) * (float)iVar4 * 0.5 + -0.5;
                  }
                  else {
                    fVar54 = (fVar54 * 0.5 + 0.5) * (float)(iVar4 + -1);
                  }
                  fVar54 = compute_coord(fVar54,iVar4,iVar18,iVar17);
                  if (iVar17 == 0) {
                    fVar39 = (fVar39 + 1.0) * (float)local_148 + -0.5;
                  }
                  else {
                    fVar39 = (fVar39 * 0.5 + 0.5) * (float)(iVar5 + -1);
                  }
                  fVar39 = compute_coord(fVar39,iVar5,iVar18,iVar17);
                  *(float *)((long)local_298 + lVar34 * 4) = fVar53;
                  *(float *)((long)pvVar26 + lVar34 * 4) = fVar54;
                  *(float *)(local_238 + lVar34 * 4) = fVar39;
                  pfVar36 = pfVar36 + 3;
                  lVar34 = lVar34 + 1;
                  lVar33 = lVar33 + -4;
                } while (iVar6 != (int)lVar34);
                local_238 = local_238 - lVar33;
                pvVar26 = (void *)((long)pvVar26 - lVar33);
                local_298 = (void *)((long)local_298 - lVar33);
                iVar22 = (int)(float)local_168;
              }
              iVar22 = iVar22 + 1;
            } while (iVar22 != iVar7);
          }
          uVar28 = uVar28 + 1;
        } while ((void *)uVar28 != local_178);
      }
    }
    else if (0 < (int)(float)local_178) {
      lVar33 = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) * local_1c8.cstep;
      local_238 = (long)((long)local_1c8.data + lVar33 * 2);
      local_280 = (void *)(lVar33 + (long)local_1c8.data);
      pvVar25 = pMVar8[1].data;
      lVar33 = pMVar8[1].elemsize * pMVar8[1].cstep;
      local_288 = (void *)((long)pvVar25 + lVar33 * 2);
      pvVar26 = (void *)(lVar33 + (long)pvVar25);
      local_158 = (void *)CONCAT44(local_158._4_4_,(float)(iVar4 + -1));
      local_148 = (void *)CONCAT44(local_148._4_4_,(float)iVar3 * 0.5);
      local_168 = (void *)CONCAT44(local_168._4_4_,(float)iVar4 * 0.5);
      uVar15 = 0;
      do {
        local_128 = (void *)(ulong)uVar15;
        if (0 < iVar7) {
          iVar18 = this->padding_mode;
          iVar17 = this->align_corner;
          iVar22 = 0;
          do {
            if (0 < iVar6) {
              lVar33 = 0;
              iVar14 = iVar6;
              do {
                if (iVar17 == 0) {
                  fVar53 = (*(float *)((long)pvVar25 + lVar33) + 1.0) * (float)local_148 + -0.5;
                }
                else {
                  fVar53 = (*(float *)((long)pvVar25 + lVar33) * 0.5 + 0.5) * (float)(iVar3 + -1);
                }
                fVar54 = *(float *)((long)pvVar26 + lVar33);
                fVar39 = *(float *)((long)local_288 + lVar33);
                fVar53 = compute_coord(fVar53,iVar3,iVar18,iVar17);
                if (iVar17 == 0) {
                  fVar54 = (fVar54 + 1.0) * (float)local_168 + -0.5;
                }
                else {
                  fVar54 = (fVar54 * 0.5 + 0.5) * (float)local_158;
                }
                fVar54 = compute_coord(fVar54,iVar4,iVar18,iVar17);
                if (iVar17 == 0) {
                  fVar39 = (fVar39 + 1.0) * (float)iVar5 * 0.5 + -0.5;
                }
                else {
                  fVar39 = (fVar39 * 0.5 + 0.5) * (float)(iVar5 + -1);
                }
                fVar39 = compute_coord(fVar39,iVar5,iVar18,iVar17);
                *(float *)((long)local_298 + lVar33) = fVar53;
                *(float *)((long)local_280 + lVar33) = fVar54;
                *(float *)(local_238 + lVar33) = fVar39;
                lVar33 = lVar33 + 4;
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
              local_238 = local_238 + lVar33;
              local_280 = (void *)((long)local_280 + lVar33);
              local_298 = (void *)((long)local_298 + lVar33);
              local_288 = (void *)((long)local_288 + lVar33);
              pvVar26 = (void *)((long)pvVar26 + lVar33);
              pvVar25 = (void *)((long)pvVar25 + lVar33);
            }
            iVar22 = iVar22 + 1;
          } while (iVar22 != iVar7);
        }
        uVar15 = (int)local_128 + 1;
      } while ((float)uVar15 != (float)local_178);
    }
    pvVar25 = local_1c8.data;
    iVar3 = this->sample_type;
    bVar38 = true;
    if (iVar3 == 1) {
      if (0 < (int)uVar16) {
        iVar3 = pMVar8->w;
        iVar4 = pMVar8->h;
        iVar5 = pMVar8->d;
        local_128 = pMVar8->data;
        local_f8._0_8_ = pMVar8->cstep * pMVar8->elemsize;
        local_58 = local_130->cstep * local_130->elemsize;
        local_68 = local_130->data;
        lVar33 = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) * local_1c8.cstep
        ;
        local_110 = (void *)((long)local_1c8.data + lVar33);
        local_78 = local_1c8.data;
        local_88 = (void *)((long)local_1c8.data + lVar33 * 2);
        lVar34 = pMVar8->elemsize * (long)iVar3;
        lVar33 = iVar4 * lVar34;
        local_218 = 0;
        do {
          pvVar25 = local_128;
          if (0 < (int)(float)local_178) {
            lVar37 = local_f8._0_8_ * local_218;
            local_288 = (void *)(local_58 * local_218 + (long)local_68);
            local_168 = (void *)((ulong)local_168 & 0xffffffff00000000);
            local_1d8 = local_88;
            local_158 = local_110;
            local_1e8 = local_78;
            do {
              if (0 < iVar7) {
                iVar18 = 0;
                do {
                  if (0 < iVar6) {
                    local_148 = (void *)CONCAT44(local_148._4_4_,iVar18);
                    lVar21 = 0;
                    lVar29 = 0;
                    do {
                      fVar53 = *(float *)((long)local_1e8 + lVar29 * 4);
                      fVar54 = *(float *)((long)local_158 + lVar29 * 4);
                      fVar39 = *(float *)((long)local_1d8 + lVar29 * 4);
                      fVar40 = floorf(fVar53);
                      uVar32 = (uint)fVar40;
                      fVar40 = floorf(fVar54);
                      uVar15 = (uint)fVar40;
                      fVar40 = floorf(fVar39);
                      uVar16 = (uint)fVar40;
                      fVar41 = 0.0;
                      lVar27 = (long)(int)uVar15;
                      fVar40 = 0.0;
                      if (((-1 < (int)(uVar15 | uVar32 | uVar16)) && ((int)uVar32 < iVar3)) &&
                         (((int)uVar15 < iVar4 && ((int)uVar16 < iVar5)))) {
                        fVar40 = *(float *)((long)pvVar25 +
                                           (long)(int)uVar32 * 4 +
                                           lVar34 * lVar27 + (int)uVar16 * lVar33 + lVar37);
                      }
                      uVar35 = uVar32 + 1;
                      if (((-1 < (int)(uVar35 | uVar15 | uVar16)) && ((int)uVar35 < iVar3)) &&
                         (((int)uVar15 < iVar4 && ((int)uVar16 < iVar5)))) {
                        fVar41 = *(float *)((long)pvVar25 +
                                           (long)(int)uVar35 * 4 +
                                           lVar34 * lVar27 + (int)uVar16 * lVar33 + lVar37);
                      }
                      uVar30 = uVar15 + 1;
                      fVar43 = 0.0;
                      fVar42 = 0.0;
                      if ((((-1 < (int)(uVar30 | uVar32 | uVar16)) && ((int)uVar32 < iVar3)) &&
                          ((int)uVar30 < iVar4)) && ((int)uVar16 < iVar5)) {
                        fVar42 = *(float *)((long)pvVar25 +
                                           (long)(int)uVar32 * 4 +
                                           (int)uVar30 * lVar34 + (int)uVar16 * lVar33 + lVar37);
                      }
                      if (((-1 < (int)(uVar30 | uVar35 | uVar16)) && ((int)uVar35 < iVar3)) &&
                         (((int)uVar30 < iVar4 && ((int)uVar16 < iVar5)))) {
                        fVar43 = *(float *)((long)pvVar25 +
                                           (long)(int)uVar35 * 4 +
                                           (int)uVar30 * lVar34 + (int)uVar16 * lVar33 + lVar37);
                      }
                      uVar1 = uVar16 + 1;
                      fVar45 = 0.0;
                      fVar44 = 0.0;
                      if ((int)uVar1 < iVar5 &&
                          (((int)uVar32 < iVar3 && (int)uVar15 < iVar4) &&
                          -1 < (int)(uVar15 | uVar32 | uVar1))) {
                        fVar44 = *(float *)((long)pvVar25 +
                                           (long)(int)uVar32 * 4 +
                                           (int)uVar1 * lVar33 + lVar34 * lVar27 + lVar37);
                      }
                      if ((((int)uVar15 < iVar4 && (int)uVar35 < iVar3) &&
                          -1 < (int)(uVar35 | uVar15 | uVar1)) && (int)uVar1 < iVar5) {
                        fVar45 = *(float *)((long)pvVar25 +
                                           (long)(int)uVar35 * 4 +
                                           (int)uVar1 * lVar33 + lVar27 * lVar34 + lVar37);
                      }
                      fVar48 = 0.0;
                      fVar46 = 0.0;
                      if (((-1 < (int)(uVar30 | uVar32 | uVar1)) && ((int)uVar32 < iVar3)) &&
                         (((int)uVar30 < iVar4 && ((int)uVar1 < iVar5)))) {
                        fVar46 = *(float *)((long)pvVar25 +
                                           (long)(int)uVar32 * 4 +
                                           (int)uVar30 * lVar34 + (int)uVar1 * lVar33 + lVar37);
                      }
                      if ((((-1 < (int)(uVar30 | uVar35 | uVar1)) && ((int)uVar35 < iVar3)) &&
                          ((int)uVar30 < iVar4)) && ((int)uVar1 < iVar5)) {
                        fVar48 = *(float *)((long)pvVar25 +
                                           (long)(int)uVar35 * 4 +
                                           (int)uVar30 * lVar34 + (int)uVar1 * lVar33 + lVar37);
                      }
                      fVar53 = fVar53 - (float)(int)uVar32;
                      fVar54 = fVar54 - (float)(int)uVar15;
                      fVar49 = 1.0 - fVar53;
                      fVar40 = fVar54 * (fVar43 * fVar53 + fVar42 * fVar49) +
                               (1.0 - fVar54) * (fVar40 * fVar49 + fVar41 * fVar53);
                      *(float *)((long)local_288 + lVar29 * 4) =
                           (((1.0 - fVar54) * (fVar44 * fVar49 + fVar45 * fVar53) - fVar40) +
                           fVar54 * (fVar48 * fVar53 + fVar46 * fVar49)) *
                           (fVar39 - (float)(int)uVar16) + fVar40;
                      lVar29 = lVar29 + 1;
                      lVar21 = lVar21 + -4;
                    } while (iVar6 != (int)lVar29);
                    local_1d8 = (void *)((long)local_1d8 - lVar21);
                    local_158 = (void *)((long)local_158 - lVar21);
                    local_1e8 = (void *)((long)local_1e8 - lVar21);
                    local_288 = (void *)((long)local_288 - lVar21);
                    iVar18 = (int)(float)local_148;
                  }
                  iVar18 = iVar18 + 1;
                } while (iVar18 != iVar7);
              }
              iVar18 = (int)(float)local_168 + 1;
              local_168 = (void *)CONCAT44(local_168._4_4_,iVar18);
            } while ((float)iVar18 != (float)local_178);
          }
          local_218 = local_218 + 1;
        } while (local_218 != uVar19);
      }
      goto LAB_005d89c8;
    }
    if (iVar3 == 2) {
      if (0 < (int)uVar16) {
        iVar3 = pMVar8->w;
        iVar4 = pMVar8->h;
        iVar5 = pMVar8->d;
        local_158 = pMVar8->data;
        sVar9 = pMVar8->elemsize;
        sVar12 = pMVar8->cstep;
        local_148 = (void *)(local_130->cstep * local_130->elemsize);
        local_168 = local_130->data;
        lVar33 = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) * local_1c8.cstep
        ;
        local_128 = (void *)((long)local_1c8.data + lVar33);
        local_f8._0_8_ = (void *)((long)local_1c8.data + lVar33 * 2);
        lVar33 = sVar9 * (long)iVar3;
        local_1d8 = (void *)0x0;
        do {
          pvVar26 = local_158;
          if (0 < (int)(float)local_178) {
            local_2a8 = (void *)((long)local_148 * (long)local_1d8 + (long)local_168);
            iVar18 = 0;
            local_2b0 = local_f8._0_8_;
            pvVar23 = pvVar25;
            pvVar20 = local_128;
            do {
              if (0 < iVar7) {
                iVar17 = 0;
                do {
                  if (0 < iVar6) {
                    lVar37 = 0;
                    lVar34 = 0;
                    do {
                      fVar53 = floorf(*(float *)((long)pvVar23 + lVar34 * 4) + 0.5);
                      uVar15 = (uint)fVar53;
                      fVar53 = floorf(*(float *)((long)pvVar20 + lVar34 * 4) + 0.5);
                      uVar32 = (uint)fVar53;
                      fVar53 = floorf(*(float *)(local_2b0 + lVar34 * 4) + 0.5);
                      uVar16 = (uint)fVar53;
                      uVar47 = 0;
                      if (((-1 < (int)(uVar32 | uVar15 | uVar16)) && ((int)uVar15 < iVar3)) &&
                         (((int)uVar32 < iVar4 && ((int)uVar16 < iVar5)))) {
                        uVar47 = *(undefined4 *)
                                  ((long)pvVar26 +
                                  (long)(int)uVar15 * 4 +
                                  (int)uVar32 * lVar33 +
                                  (long)(int)uVar16 * iVar4 * lVar33 +
                                  sVar12 * sVar9 * (long)local_1d8);
                      }
                      *(undefined4 *)((long)local_2a8 + lVar34 * 4) = uVar47;
                      lVar34 = lVar34 + 1;
                      lVar37 = lVar37 + -4;
                    } while (iVar6 != (int)lVar34);
                    local_2b0 = local_2b0 - lVar37;
                    pvVar20 = (void *)((long)pvVar20 - lVar37);
                    pvVar23 = (void *)((long)pvVar23 - lVar37);
                    local_2a8 = (void *)((long)local_2a8 - lVar37);
                  }
                  iVar17 = iVar17 + 1;
                } while (iVar17 != iVar7);
              }
              iVar18 = iVar18 + 1;
            } while ((float)iVar18 != (float)local_178);
          }
          local_1d8 = (void *)((long)local_1d8 + 1);
        } while (local_1d8 != (void *)uVar19);
      }
      goto LAB_005d89c8;
    }
    bVar38 = true;
    if (iVar3 != 3) goto LAB_005d89c8;
    forward();
    local_21c = -1;
  }
  bVar38 = false;
LAB_005d89c8:
  piVar13 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_1c8.allocator == (Allocator *)0x0) {
        if (local_1c8.data != (void *)0x0) {
          free(local_1c8.data);
        }
      }
      else {
        (*(local_1c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (bVar38) {
    return 0;
  }
  return local_21c;
}

Assistant:

int GridSample::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (dims == 3)
    {
        int outw = permute_fusion == 0 ? grid.h : grid.w;
        int outh = permute_fusion == 0 ? grid.c : grid.h;

        top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);

        Mat offset_blob;
        offset_blob.create(outw, outh, grid.c, elemsize, opt.workspace_allocator);

        if (top_blob.empty() || offset_blob.empty())
            return -100;

        //pre-calculate all interpolation offsets for each x y, unpack grid on-the-fly
        if (permute_fusion == 0)
        {
            float* offsetptr_x = offset_blob.channel(0);
            float* offsetptr_y = offset_blob.channel(1);

            for (int y = 0; y < outh; y++)
            {
                const float* gridptr = grid.channel(y);
                for (int x = 0; x < outw; x++)
                {
                    float sample_x = gridptr[0];
                    float sample_y = gridptr[1];

                    sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                    sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                    *offsetptr_x = sample_x;
                    *offsetptr_y = sample_y;

                    gridptr += 2;
                    offsetptr_x++;
                    offsetptr_y++;
                }
            }
        }
        else
        {
            const float* gridptr_x = grid.channel(0);
            const float* gridptr_y = grid.channel(1);
            float* offsetptr_x = offset_blob.channel(0);
            float* offsetptr_y = offset_blob.channel(1);

            for (int y = 0; y < outh; y++)
            {
                for (int x = 0; x < outw; x++)
                {
                    float sample_x = *gridptr_x;
                    float sample_y = *gridptr_y;

                    sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                    sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                    *offsetptr_x = sample_x;
                    *offsetptr_y = sample_y;

                    gridptr_x++;
                    gridptr_y++;
                    offsetptr_x++;
                    offsetptr_y++;
                }
            }
        }

        if (sample_type == Interpolation_BILINEAR) // bilinear
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                const float* offsetptr_x = offset_blob.channel(0);
                const float* offsetptr_y = offset_blob.channel(1);

                for (int y = 0; y < outh; y++)
                {
                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = *offsetptr_x;
                        float sample_y = *offsetptr_y;

                        // bilinear interpolate
                        float v;
                        {
                            sample_x = compute_coord(sample_x, w, padding_mode, align_corner);
                            sample_y = compute_coord(sample_y, h, padding_mode, align_corner);
                            int x0 = floor(sample_x);
                            int y0 = floor(sample_y);
                            int x1 = x0 + 1;
                            int y1 = y0 + 1;

                            float v00 = get_value_bounded(image, x0, y0);
                            float v01 = get_value_bounded(image, x1, y0);
                            float v10 = get_value_bounded(image, x0, y1);
                            float v11 = get_value_bounded(image, x1, y1);

                            float alpha = sample_x - x0;
                            float beta = sample_y - y0;

                            float v0 = v00 * (1 - alpha) + v01 * alpha;
                            float v1 = v10 * (1 - alpha) + v11 * alpha;

                            v = v0 * (1 - beta) + v1 * beta;
                        }

                        outptr[0] = v;
                        outptr += 1;

                        offsetptr_x++;
                        offsetptr_y++;
                    }
                }
            }
        }
        else if (sample_type == Interpolation_NEAREST) // nearest
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                const float* offsetptr_x = offset_blob.channel(0);
                const float* offsetptr_y = offset_blob.channel(1);

                for (int y = 0; y < outh; y++)
                {
                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = *offsetptr_x;
                        float sample_y = *offsetptr_y;
                        sample_x = compute_coord(sample_x, w, padding_mode, align_corner);
                        sample_y = compute_coord(sample_y, h, padding_mode, align_corner);

                        int x0 = static_cast<int>(floor(sample_x + 0.5f));
                        int y0 = static_cast<int>(floor(sample_y + 0.5f));

                        float v = get_value_bounded(image, x0, y0);

                        outptr[0] = v;
                        outptr += 1;

                        offsetptr_x++;
                        offsetptr_y++;
                    }
                }
            }
        }
        else if (sample_type == Interpolation_BICUBIC) // bicubic
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                const float* offsetptr_x = offset_blob.channel(0);
                const float* offsetptr_y = offset_blob.channel(1);

                for (int y = 0; y < outh; y++)
                {
                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = *offsetptr_x;
                        float sample_y = *offsetptr_y;

                        // bicubic interpolate
                        float v;
                        {
                            int x1 = (int)floorf(sample_x);
                            int y1 = (int)floorf(sample_y);
                            int x0 = x1 - 1;
                            int y0 = y1 - 1;
                            int x2 = x1 + 1;
                            int y2 = y1 + 1;
                            int x3 = x1 + 2;
                            int y3 = y1 + 2;

                            float v00 = get_value_bounded(image, x0, y0, padding_mode, align_corner);
                            float v01 = get_value_bounded(image, x1, y0, padding_mode, align_corner);
                            float v02 = get_value_bounded(image, x2, y0, padding_mode, align_corner);
                            float v03 = get_value_bounded(image, x3, y0, padding_mode, align_corner);
                            float v10 = get_value_bounded(image, x0, y1, padding_mode, align_corner);
                            float v11 = get_value_bounded(image, x1, y1, padding_mode, align_corner);
                            float v12 = get_value_bounded(image, x2, y1, padding_mode, align_corner);
                            float v13 = get_value_bounded(image, x3, y1, padding_mode, align_corner);
                            float v20 = get_value_bounded(image, x0, y2, padding_mode, align_corner);
                            float v21 = get_value_bounded(image, x1, y2, padding_mode, align_corner);
                            float v22 = get_value_bounded(image, x2, y2, padding_mode, align_corner);
                            float v23 = get_value_bounded(image, x3, y2, padding_mode, align_corner);
                            float v30 = get_value_bounded(image, x0, y3, padding_mode, align_corner);
                            float v31 = get_value_bounded(image, x1, y3, padding_mode, align_corner);
                            float v32 = get_value_bounded(image, x2, y3, padding_mode, align_corner);
                            float v33 = get_value_bounded(image, x3, y3, padding_mode, align_corner);

                            float x_coeffs[4];
                            float y_coeffs[4];
                            interpolate_cubic(sample_x - x1, x_coeffs);
                            interpolate_cubic(sample_y - y1, y_coeffs);

                            float v0 = v00 * x_coeffs[0] + v01 * x_coeffs[1] + v02 * x_coeffs[2] + v03 * x_coeffs[3];
                            float v1 = v10 * x_coeffs[0] + v11 * x_coeffs[1] + v12 * x_coeffs[2] + v13 * x_coeffs[3];
                            float v2 = v20 * x_coeffs[0] + v21 * x_coeffs[1] + v22 * x_coeffs[2] + v23 * x_coeffs[3];
                            float v3 = v30 * x_coeffs[0] + v31 * x_coeffs[1] + v32 * x_coeffs[2] + v33 * x_coeffs[3];

                            v = v0 * y_coeffs[0] + v1 * y_coeffs[1] + v2 * y_coeffs[2] + v3 * y_coeffs[3];
                        }

                        outptr[0] = v;
                        outptr += 1;

                        offsetptr_x++;
                        offsetptr_y++;
                    }
                }
            }
        }
    }

    if (dims == 4)
    {
        int outw = permute_fusion == 0 ? grid.h : grid.w;
        int outh = permute_fusion == 0 ? grid.d : grid.h;
        int outd = permute_fusion == 0 ? grid.c : grid.d;

        top_blob.create(outw, outh, outd, channels, elemsize, opt.blob_allocator);

        Mat offset_blob;
        offset_blob.create(outw, outh, outd, grid.c, elemsize, opt.workspace_allocator);

        if (top_blob.empty() || offset_blob.empty())
            return -100;

        //pre-calculate all interpolation offsets for each x y, unpack grid on-the-fly
        if (permute_fusion == 0)
        {
            float* offsetptr_x = offset_blob.channel(0);
            float* offsetptr_y = offset_blob.channel(1);
            float* offsetptr_z = offset_blob.channel(2);

            for (int z = 0; z < outd; z++)
            {
                const float* gridptr = grid.channel(z);
                for (int y = 0; y < outh; y++)
                {
                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = gridptr[0];
                        float sample_y = gridptr[1];
                        float sample_z = gridptr[2];

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_x = compute_coord(sample_x, w, padding_mode, align_corner);

                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);
                        sample_y = compute_coord(sample_y, h, padding_mode, align_corner);

                        sample_z = grid_sample_unormalize(d, sample_z, align_corner);
                        sample_z = compute_coord(sample_z, d, padding_mode, align_corner);

                        *offsetptr_x = sample_x;
                        *offsetptr_y = sample_y;
                        *offsetptr_z = sample_z;

                        gridptr += 3;
                        offsetptr_x++;
                        offsetptr_y++;
                        offsetptr_z++;
                    }
                }
            }
        }
        else
        {
            const float* gridptr_x = grid.channel(0);
            const float* gridptr_y = grid.channel(1);
            const float* gridptr_z = grid.channel(2);
            float* offsetptr_x = offset_blob.channel(0);
            float* offsetptr_y = offset_blob.channel(1);
            float* offsetptr_z = offset_blob.channel(2);

            for (int z = 0; z < outd; z++)
            {
                for (int y = 0; y < outh; y++)
                {
                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = *gridptr_x;
                        float sample_y = *gridptr_y;
                        float sample_z = *gridptr_z;

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_x = compute_coord(sample_x, w, padding_mode, align_corner);

                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);
                        sample_y = compute_coord(sample_y, h, padding_mode, align_corner);

                        sample_z = grid_sample_unormalize(d, sample_z, align_corner);
                        sample_z = compute_coord(sample_z, d, padding_mode, align_corner);

                        *offsetptr_x = sample_x;
                        *offsetptr_y = sample_y;
                        *offsetptr_z = sample_z;

                        gridptr_x++;
                        gridptr_y++;
                        gridptr_z++;
                        offsetptr_x++;
                        offsetptr_y++;
                        offsetptr_z++;
                    }
                }
            }
        }

        if (sample_type == Interpolation_BILINEAR) // bilinear
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                const float* offsetptr_x = offset_blob.channel(0);
                const float* offsetptr_y = offset_blob.channel(1);
                const float* offsetptr_z = offset_blob.channel(2);

                for (int z = 0; z < outd; z++)
                {
                    for (int y = 0; y < outh; y++)
                    {
                        for (int x = 0; x < outw; x++)
                        {
                            float sample_x = *offsetptr_x;
                            float sample_y = *offsetptr_y;
                            float sample_z = *offsetptr_z;

                            // bilinear interpolate
                            float v;
                            {
                                int x0 = (int)floor(sample_x);
                                int y0 = (int)floor(sample_y);
                                int z0 = (int)floor(sample_z);
                                int x1 = x0 + 1;
                                int y1 = y0 + 1;
                                int z1 = z0 + 1;

                                float v000 = get_value_bounded(image, x0, y0, z0);
                                float v001 = get_value_bounded(image, x1, y0, z0);
                                float v010 = get_value_bounded(image, x0, y1, z0);
                                float v011 = get_value_bounded(image, x1, y1, z0);
                                float v100 = get_value_bounded(image, x0, y0, z1);
                                float v101 = get_value_bounded(image, x1, y0, z1);
                                float v110 = get_value_bounded(image, x0, y1, z1);
                                float v111 = get_value_bounded(image, x1, y1, z1);

                                float alpha = sample_x - x0;
                                float beta = sample_y - y0;
                                float gamma = sample_z - z0;

                                float v00 = v000 * (1 - alpha) + v001 * alpha;
                                float v01 = v010 * (1 - alpha) + v011 * alpha;
                                float v10 = v100 * (1 - alpha) + v101 * alpha;
                                float v11 = v110 * (1 - alpha) + v111 * alpha;

                                float v0 = v00 * (1 - beta) + v01 * beta;
                                float v1 = v10 * (1 - beta) + v11 * beta;

                                v = v0 * (1 - gamma) + v1 * gamma;
                            }

                            outptr[0] = v;
                            outptr += 1;

                            offsetptr_x++;
                            offsetptr_y++;
                            offsetptr_z++;
                        }
                    }
                }
            }
        }
        else if (sample_type == Interpolation_NEAREST) // nearest
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                const float* offsetptr_x = offset_blob.channel(0);
                const float* offsetptr_y = offset_blob.channel(1);
                const float* offsetptr_z = offset_blob.channel(2);

                for (int z = 0; z < outd; z++)
                {
                    for (int y = 0; y < outh; y++)
                    {
                        for (int x = 0; x < outw; x++)
                        {
                            float sample_x = *offsetptr_x;
                            float sample_y = *offsetptr_y;
                            float sample_z = *offsetptr_z;

                            int x0 = static_cast<int>(floor(sample_x + 0.5f));
                            int y0 = static_cast<int>(floor(sample_y + 0.5f));
                            int z0 = static_cast<int>(floor(sample_z + 0.5f));

                            float v = get_value_bounded(image, x0, y0, z0);

                            outptr[0] = v;
                            outptr += 1;

                            offsetptr_x++;
                            offsetptr_y++;
                            offsetptr_z++;
                        }
                    }
                }
            }
        }
        else if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -1;
        }
    }

    return 0;
}